

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_closedir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  io_private *pDev;
  jx9_io_stream *pjVar1;
  char *pcVar2;
  
  if ((((nArg < 1) || (((*apArg)->iFlags & 0x100) == 0)) ||
      (pDev = (io_private *)((*apArg)->x).iVal, pDev == (io_private *)0x0)) ||
     (pDev->iMagic != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
  }
  else {
    pjVar1 = pDev->pStream;
    if (pjVar1 == (jx9_io_stream *)0x0) {
      pcVar2 = "null_stream";
    }
    else {
      if (pjVar1->xCloseDir != (_func_void_void_ptr *)0x0) {
        (*pjVar1->xCloseDir)(pDev->pHandle);
        ReleaseIOPrivate(pCtx,pDev);
        jx9MemObjRelease(*apArg);
        return 0;
      }
      pcVar2 = pjVar1->zName;
    }
    jx9_context_throw_error_format
              (pCtx,2,
               "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
               ,(pCtx->pFunc->sName).zString,pcVar2);
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_closedir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	io_private *pDev;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xCloseDir == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	pStream->xCloseDir(pDev->pHandle);
	/* Release the private stucture */
	ReleaseIOPrivate(pCtx, pDev);
	jx9MemObjRelease(apArg[0]);
	return JX9_OK;
 }